

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dml.cpp
# Opt level: O3

void __thiscall dml::listRecords(dml *this,string *typeName,ostream *stream)

{
  pointer pcVar1;
  long lVar2;
  uint uVar3;
  pointer prVar4;
  ostream *this_00;
  _Base_ptr p_Var5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  undefined8 *puVar9;
  long *plVar10;
  ostream *poVar11;
  ulong uVar12;
  size_type *__nbytes;
  size_t __nbytes_00;
  void *__buf;
  uint __len;
  void *__buf_00;
  int __fd;
  undefined8 uVar13;
  pointer prVar14;
  uint32_t uVar15;
  int iVar16;
  page page;
  vector<record,_std::allocator<record>_> pageRecords;
  string __str;
  file file;
  fstream currFile;
  page local_378;
  long local_368;
  undefined8 uStack_360;
  undefined1 local_358 [24];
  long lStack_340;
  undefined4 local_338;
  uint local_334;
  pointer *local_330;
  long local_328;
  pointer local_320 [2];
  file local_310;
  ulong *local_2d8;
  long local_2d0;
  ulong local_2c8 [2];
  vector<record,_std::allocator<record>_> local_2b8;
  string local_298;
  string local_278;
  ostream *local_258;
  _Base_ptr local_250;
  string *local_248;
  fstream local_240 [528];
  
  local_248 = typeName;
  local_250 = (_Base_ptr)SystemCatalog::getType(this->systemCatalog,typeName);
  if ((_Rb_tree_header *)local_250 !=
      &(this->systemCatalog->types)._M_t._M_impl.super__Rb_tree_header) {
    local_2b8.super__Vector_base<record,_std::allocator<record>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2b8.super__Vector_base<record,_std::allocator<record>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2b8.super__Vector_base<record,_std::allocator<record>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar7 = (char)local_250[2]._M_color << 2;
    local_334 = bVar7 + 1 & 0xff;
    uVar3 = 0x7fb / (ushort)(bVar7 | 2);
    local_338 = (undefined4)CONCAT62((int6)((ulong)local_250 >> 0x10),(short)uVar3);
    if (0xfe < uVar3) {
      local_338 = 0xff;
    }
    uVar15 = 1;
    local_258 = stream;
    do {
      local_2d8 = local_2c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"data/","");
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      pcVar1 = (local_248->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,pcVar1,pcVar1 + local_248->_M_string_length);
      truncateName(&local_298,&local_278);
      uVar12 = 0xf;
      if (local_2d8 != local_2c8) {
        uVar12 = local_2c8[0];
      }
      if (uVar12 < local_298._M_string_length + local_2d0) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          uVar13 = local_298.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_298._M_string_length + local_2d0) goto LAB_00107611;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2d8);
      }
      else {
LAB_00107611:
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2d8,(ulong)local_298._M_dataplus._M_p);
      }
      local_378._0_8_ = &local_368;
      plVar10 = puVar9 + 2;
      if ((long *)*puVar9 == plVar10) {
        local_368 = *plVar10;
        uStack_360 = puVar9[3];
      }
      else {
        local_368 = *plVar10;
        local_378._0_8_ = (long *)*puVar9;
      }
      local_378.slots = (uint8_t *)puVar9[1];
      *puVar9 = plVar10;
      puVar9[1] = 0;
      *(undefined1 *)plVar10 = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_378);
      local_358._0_8_ = local_358 + 0x10;
      prVar14 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == prVar14) {
        local_358._16_8_ = *(undefined8 *)prVar14;
        lStack_340 = plVar10[3];
      }
      else {
        local_358._16_8_ = *(undefined8 *)prVar14;
        local_358._0_8_ = (pointer)*plVar10;
      }
      local_358._8_8_ = plVar10[1];
      *plVar10 = (long)prVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      uVar3 = -uVar15;
      if (0 < (int)uVar15) {
        uVar3 = uVar15;
      }
      __len = 1;
      if (9 < uVar3) {
        uVar12 = (ulong)uVar3;
        uVar6 = 4;
        do {
          __len = uVar6;
          uVar8 = (uint)uVar12;
          if (uVar8 < 100) {
            __len = __len - 2;
            goto LAB_00107723;
          }
          if (uVar8 < 1000) {
            __len = __len - 1;
            goto LAB_00107723;
          }
          if (uVar8 < 10000) goto LAB_00107723;
          uVar12 = uVar12 / 10000;
          uVar6 = __len + 4;
        } while (99999 < uVar8);
        __len = __len + 1;
      }
LAB_00107723:
      local_330 = local_320;
      std::__cxx11::string::_M_construct
                ((ulong)&local_330,(char)__len - (char)((int)uVar15 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar15 >> 0x1f) + (long)local_330),__len,uVar3);
      prVar14 = (pointer)0xf;
      if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
        prVar14 = (pointer)local_358._16_8_;
      }
      if (prVar14 < (pointer)((uint8_t *)local_358._8_8_ + local_328)) {
        prVar14 = (pointer)0xf;
        if (local_330 != local_320) {
          prVar14 = local_320[0];
        }
        if (prVar14 < (pointer)((uint8_t *)local_358._8_8_ + local_328)) goto LAB_001077a6;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_330,0,(char *)0x0,local_358._0_8_);
      }
      else {
LAB_001077a6:
        puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_358,(ulong)local_330);
      }
      local_310._0_8_ = (long)&local_310 + 0x10;
      __nbytes = puVar9 + 2;
      if ((size_type *)*puVar9 == __nbytes) {
        local_310.typeName._M_string_length = *__nbytes;
        local_310.typeName.field_2._M_allocated_capacity = puVar9[3];
      }
      else {
        local_310.typeName._M_string_length = *__nbytes;
        local_310._0_8_ = (size_type *)*puVar9;
      }
      local_310.typeName._M_dataplus._M_p = (pointer)puVar9[1];
      *puVar9 = __nbytes;
      puVar9[1] = 0;
      *(undefined1 *)__nbytes = 0;
      std::fstream::fstream(local_240,(string *)&local_310,_S_in|_S_bin);
      if ((size_type *)local_310._0_8_ != (size_type *)((long)&local_310 + 0x10U)) {
        operator_delete((void *)local_310._0_8_,local_310.typeName._M_string_length + 1);
      }
      if (local_330 != local_320) {
        operator_delete(local_330,(ulong)&local_320[0]->field_0x1);
      }
      if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
        operator_delete((void *)local_358._0_8_,(ulong)(local_358._16_8_ + 1));
      }
      p_Var5 = local_250;
      if ((long *)local_378._0_8_ != &local_368) {
        operator_delete((void *)local_378._0_8_,local_368 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if (local_2d8 != local_2c8) {
        operator_delete(local_2d8,local_2c8[0] + 1);
      }
      ::file::file(&local_310);
      __fd = (int)local_240;
      ::file::read(&local_310,__fd,__buf,(size_t)__nbytes);
      if (0 < (int)local_310.numRecords) {
        iVar16 = local_310.numRecords + 1;
        __buf_00 = (void *)0x16;
        do {
          __nbytes_00 = (size_t)(byte)local_338;
          ::page::page(&local_378,'\0',local_334,(byte)local_338);
          ::page::read(&local_378,__fd,__buf_00,__nbytes_00);
          ::page::getRecords((vector<record,_std::allocator<record>_> *)local_358,&local_378,
                             local_240,(int)__buf_00,(char)p_Var5[2]._M_color);
          std::vector<record,std::allocator<record>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<record*,std::vector<record,std::allocator<record>>>>
                    ((vector<record,std::allocator<record>> *)&local_2b8,
                     local_2b8.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                     super__Vector_impl_data._M_finish,local_358._0_8_,local_358._8_8_);
          __buf_00 = (void *)(ulong)((int)__buf_00 + 0x800);
          std::vector<record,_std::allocator<record>_>::~vector
                    ((vector<record,_std::allocator<record>_> *)local_358);
          ::page::~page(&local_378);
          iVar16 = iVar16 + -1;
        } while (1 < iVar16);
      }
      uVar15 = local_310.nextFile;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310.typeName._M_dataplus._M_p != &local_310.typeName.field_2) {
        operator_delete(local_310.typeName._M_dataplus._M_p,
                        local_310.typeName.field_2._M_allocated_capacity + 1);
      }
      std::fstream::~fstream(local_240);
      this_00 = local_258;
      prVar4 = local_2b8.super__Vector_base<record,_std::allocator<record>_>._M_impl.
               super__Vector_impl_data._M_finish;
      prVar14 = local_2b8.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar15 != 0);
    if (local_2b8.super__Vector_base<record,_std::allocator<record>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_2b8.super__Vector_base<record,_std::allocator<record>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar12 = ((long)local_2b8.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_2b8.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar2 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<record*,std::vector<record,std::allocator<record>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_2b8.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_2b8.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<record*,std::vector<record,std::allocator<record>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (prVar14,prVar4);
      prVar4 = local_2b8.super__Vector_base<record,_std::allocator<record>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (prVar14 = local_2b8.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                     super__Vector_impl_data._M_start; prVar14 != prVar4; prVar14 = prVar14 + 1) {
        if (prVar14->numFields != '\0') {
          uVar12 = 0;
          do {
            poVar11 = (ostream *)
                      std::ostream::operator<<((ostream *)this_00,prVar14->fields[uVar12]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            uVar12 = uVar12 + 1;
          } while (uVar12 < prVar14->numFields);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + (char)this_00);
        std::ostream::put((char)this_00);
        std::ostream::flush();
      }
    }
    std::vector<record,_std::allocator<record>_>::~vector(&local_2b8);
  }
  return;
}

Assistant:

void dml::listRecords(string typeName, ostream &stream) {
    auto type = systemCatalog->getType(typeName);

    if(type == systemCatalog->types.end()) { return; }

    auto records = vector<record>(0);

    int currFileLink = 1;

    auto recordSize = (uint8_t) (RECORD_ID + type->numFields * FIELD);

    auto slotSize = (uint8_t) min((PAGE - PAGE_ID - NUM_RECORDS) / (recordSize+ 1), 255);

    do {
        fstream currFile(ROOT + truncateName(typeName) + INFIX + to_string(currFileLink), INBIN);

        file file;
        file.read(currFile);

        int offset = IS_FULL + TYPE_NAME + NUM_PAGES + NUM_RECORDS + LINK_TO_FILE + LINK_TO_FILE;

        for (int i = file.numRecords; i > 0; --i) {
            page page(0, recordSize, slotSize);

            page.read(currFile, offset);

            vector<record> pageRecords = page.getRecords(currFile, offset, type->numFields);

            records.insert(records.end(), pageRecords.begin(), pageRecords.end());

            offset += PAGE;
        }

        currFileLink = file.nextFile;
    } while(currFileLink != 0);

    sort(records.begin(), records.end());

    for (const auto &record: records) {

        for (int i = 0; i < record.numFields; ++i) {
            stream << record.fields[i] << " ";
        }

        stream << endl;
    }
}